

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::CategoricalCrossEntropyLossLayer::MergePartialFromCodedStream
          (CategoricalCrossEntropyLossLayer *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  char *field_name;
  int size;
  ulong uVar6;
  string *psVar7;
  pointer data;
  ArenaStringPtr *this_01;
  
  this_00 = &this->target_;
  this_01 = &this->input_;
LAB_0013c3ee:
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0013c411;
      input->buffer_ = pbVar2 + 1;
      uVar6 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0013c411:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar6 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar6 = 0x100000000;
      }
      uVar6 = uVar4 | uVar6;
    }
    uVar4 = (uint32)uVar6;
    if ((uVar6 & 0x100000000) == 0) {
LAB_0013c4dc:
      if (uVar4 == 0) {
        return true;
      }
      if ((uVar4 & 7) == 4) {
        return true;
      }
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
      if (!bVar3) {
        return false;
      }
      goto LAB_0013c3ee;
    }
    uVar5 = (uint)(uVar6 >> 3) & 0x1fffffff;
    if (uVar5 == 2) {
      if ((char)uVar6 == '\x12') {
        psVar7 = this_00->ptr_;
        if (psVar7 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar7 = this_00->ptr_;
        }
        bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar7);
        if (!bVar3) {
          return false;
        }
        data = (this_00->ptr_->_M_dataplus)._M_p;
        size = (int)this_00->ptr_->_M_string_length;
        field_name = "CoreML.Specification.CategoricalCrossEntropyLossLayer.target";
        goto LAB_0013c4cd;
      }
      goto LAB_0013c4dc;
    }
    if ((uVar5 != 1) || ((char)uVar6 != '\n')) goto LAB_0013c4dc;
    psVar7 = this_01->ptr_;
    if (psVar7 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (this_01,(string *)
                         &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      psVar7 = this_01->ptr_;
    }
    bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar7);
    if (!bVar3) {
      return false;
    }
    data = (this_01->ptr_->_M_dataplus)._M_p;
    size = (int)this_01->ptr_->_M_string_length;
    field_name = "CoreML.Specification.CategoricalCrossEntropyLossLayer.input";
LAB_0013c4cd:
    bVar3 = google::protobuf::internal::WireFormatLite::VerifyUtf8String(data,size,PARSE,field_name)
    ;
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool CategoricalCrossEntropyLossLayer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string input = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_input()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->input().data(), this->input().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CategoricalCrossEntropyLossLayer.input"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string target = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_target()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->target().data(), this->target().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CategoricalCrossEntropyLossLayer.target"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  return false;
#undef DO_
}